

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O3

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::initialize(DepthBiasBaseCase *this)

{
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar1;
  int *piVar2;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar3;
  deInt32 *pdVar4;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar5;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar6;
  VkPipelineLayout obj;
  DeviceInterface *pDVar7;
  SharedPtrStateBase *pSVar8;
  VkImage VVar9;
  VkImageView VVar10;
  VkRenderPass VVar11;
  VkPipeline obj_00;
  VkFramebuffer obj_01;
  Allocation *pAVar12;
  VkAllocationCallbacks *pVVar13;
  Buffer *pBVar14;
  VkCommandPool obj_02;
  VkSubpassDescription subpass;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  undefined1 auVar15 [8];
  VkDevice pVVar16;
  Handle<(vk::HandleType)17> HVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  void *pvVar21;
  VkAttachmentDescription *pVVar22;
  deUint32 _queueFamilyIndex;
  VkDevice pVVar23;
  InstanceInterface *pIVar24;
  VkPhysicalDevice pVVar25;
  const_iterator cVar26;
  Allocator *pAVar27;
  NotSupportedError *this_00;
  long lVar28;
  VkFormat VVar29;
  PipelineCreateInfo *pPVar30;
  undefined8 *puVar31;
  VkDeviceSize _size;
  byte bVar32;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined1 local_7b8 [8];
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_7b0;
  Handle<(vk::HandleType)17> local_798;
  undefined1 auStack_790 [24];
  VkPipelineColorBlendAttachmentState *local_778;
  VkSpecializationInfo *pVStack_770;
  pointer local_768;
  pointer local_760;
  pointer local_758;
  pointer local_750;
  pointer local_740;
  FramebufferCreateInfo framebufferCreateInfo;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_6d8;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_6b8;
  VkShaderModule local_698;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_690;
  VkShaderModule local_678;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_670;
  VkFormatProperties formatProperties;
  RenderPassCreateInfo renderPassCreateInfo;
  PipelineCreateInfo pipelineCreateInfo;
  VkAttachmentReference colorAttachmentReference;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  Attachment vkCbAttachmentState;
  ImageCreateInfo depthStencilImageCreateInfo;
  ImageCreateInfo targetImageCreateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  ImageViewCreateInfo attachmentViewInfo;
  ImageViewCreateInfo colorTargetViewInfo;
  
  bVar32 = 0;
  pVVar23 = Context::getDevice((this->super_TestInstance).m_context);
  pIVar24 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar25 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  VVar29 = VK_FORMAT_D24_UNORM_S8_UINT;
  (*pIVar24->_vptr_InstanceInterface[3])(pIVar24,pVVar25,0x81);
  if ((formatProperties.optimalTilingFeatures._1_1_ & 2) == 0) {
    pIVar24 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar25 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    VVar29 = VK_FORMAT_D32_SFLOAT_S8_UINT;
    (*pIVar24->_vptr_InstanceInterface[3])(pIVar24,pVVar25,0x82);
    if ((formatProperties.optimalTilingFeatures._1_1_ & 2) == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ =
           &pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&pipelineCreateInfo,"No valid depth stencil attachment available","");
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&pipelineCreateInfo);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this->m_depthStencilAttachmentFormat = VVar29;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&pipelineCreateInfo,0,(VkPushConstantRange *)0x0);
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ != 0) {
    operator_delete((void *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_,
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_ -
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_);
  }
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&renderPassCreateInfo,this->m_vk,pVVar23,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  pVVar22 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  uVar19 = renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  pvVar21 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  uVar18 = renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  pMVar1 = &this->m_pipelineLayout;
  obj.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device
         = (VkDevice)uVar19;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVVar22;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal = uVar18;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj);
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device
         = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
                 &renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext,
                 (VkPipelineLayout)renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_);
    }
  }
  pDVar7 = this->m_vk;
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,
                  &this->m_vertexShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar7,pVVar23,
             *(ProgramBinary **)(cVar26._M_node + 2),0);
  DStack_670.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_670.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_678.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_670.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pDVar7 = this->m_vk;
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,
                  &this->m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar7,pVVar23,
             *(ProgramBinary **)(cVar26._M_node + 2),0);
  DStack_690.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_690.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_698.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_690.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  _extent.depth = 1;
  _extent.width = 0x80;
  _extent.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&targetImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar7 = this->m_vk;
  pAVar27 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Image::createAndAlloc
            ((Image *)&pipelineCreateInfo,pDVar7,pVVar23,
             &targetImageCreateInfo.super_VkImageCreateInfo,pAVar27,(MemoryRequirement)0x0);
  pSVar8 = (this->m_colorTargetImage).m_state;
  if (pSVar8 == (SharedPtrStateBase *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext) {
LAB_0068897c:
    if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0) {
      LOCK();
      piVar2 = (int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
             VK_STRUCTURE_TYPE_APPLICATION_INFO;
        pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
        (**(code **)(*pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) &&
         (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0)) {
        (**(code **)(*pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8))();
      }
    }
  }
  else {
    if (pSVar8 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar4 = &pSVar8->strongRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        (this->m_colorTargetImage).m_ptr = (Image *)0x0;
        (*((this->m_colorTargetImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar4 = &((this->m_colorTargetImage).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        pSVar8 = (this->m_colorTargetImage).m_state;
        if (pSVar8 != (SharedPtrStateBase *)0x0) {
          (*pSVar8->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_colorTargetImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_colorTargetImage).m_ptr =
         (Image *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_colorTargetImage).m_state =
         (SharedPtrStateBase *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8) =
           *(int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar4 = &((this->m_colorTargetImage).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + 1;
      UNLOCK();
      goto LAB_0068897c;
    }
  }
  uVar37 = 0;
  uVar38 = 0;
  uVar35 = 1;
  uVar36 = 0;
  uVar33 = 1;
  uVar34 = 0;
  _extent_00.depth = 1;
  _extent_00.width = 0x80;
  _extent_00.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&depthStencilImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_depthStencilAttachmentFormat,
             _extent_00,1,1,VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x22,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar7 = this->m_vk;
  pAVar27 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Image::createAndAlloc
            ((Image *)&pipelineCreateInfo,pDVar7,pVVar23,
             &depthStencilImageCreateInfo.super_VkImageCreateInfo,pAVar27,(MemoryRequirement)0x0);
  pSVar8 = (this->m_depthStencilImage).m_state;
  if (pSVar8 == (SharedPtrStateBase *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext) {
LAB_00688adb:
    if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0) {
      LOCK();
      piVar2 = (int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
             VK_STRUCTURE_TYPE_APPLICATION_INFO;
        pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
        (**(code **)(*pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) &&
         (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0)) {
        (**(code **)(*pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8))();
      }
    }
  }
  else {
    if (pSVar8 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar4 = &pSVar8->strongRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        (this->m_depthStencilImage).m_ptr = (Image *)0x0;
        (*((this->m_depthStencilImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar4 = &((this->m_depthStencilImage).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        pSVar8 = (this->m_depthStencilImage).m_state;
        if (pSVar8 != (SharedPtrStateBase *)0x0) {
          (*pSVar8->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_depthStencilImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_depthStencilImage).m_ptr =
         (Image *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_depthStencilImage).m_state =
         (SharedPtrStateBase *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8) =
           *(int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar4 = &((this->m_depthStencilImage).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + 1;
      UNLOCK();
      goto LAB_00688adb;
    }
  }
  VVar9.m_internal =
       (((this->m_colorTargetImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
       m_data.object.m_internal;
  VVar29 = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&pipelineCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&colorTargetViewInfo,VVar9,VK_IMAGE_VIEW_TYPE_2D,VVar29,
             (VkComponentMapping *)&pipelineCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassCreateInfo,this->m_vk,pVVar23,
             &colorTargetViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar22 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  uVar19 = renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  pvVar21 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  uVar18 = renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  pMVar3 = &this->m_colorTargetView;
  VVar10.m_internal =
       (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar10.m_internal == 0) {
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)uVar19;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVVar22;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar18;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar10);
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                 &renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext,
                 (VkImageView)renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_);
    }
  }
  VVar9.m_internal =
       (((this->m_depthStencilImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>
       .m_data.object.m_internal;
  VVar29 = this->m_depthStencilAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&pipelineCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&attachmentViewInfo,VVar9,VK_IMAGE_VIEW_TYPE_2D,VVar29,
             (VkComponentMapping *)&pipelineCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassCreateInfo,this->m_vk,pVVar23,
             &attachmentViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar22 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  uVar19 = renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  pvVar21 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  uVar18 = renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  pMVar5 = &this->m_attachmentView;
  VVar10.m_internal =
       (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar10.m_internal == 0) {
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)uVar19;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVVar22;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar18;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar10);
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                 &renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext,
                 (VkImageView)renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_);
    }
  }
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            (&renderPassCreateInfo,0,(VkAttachmentDescription *)0x0,0,(VkSubpassDescription *)0x0,0,
             (VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&pipelineCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_GENERAL);
  attachment.samples = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  attachment.flags = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  attachment.format = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  attachment.loadOp =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext >> 0x20);
  attachment.storeOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  attachment.stencilLoadOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  attachment.stencilStoreOp = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  attachment.initialLayout =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages >> 0x20);
  attachment.finalLayout =
       (VkImageLayout)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState;
  Draw::RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&pipelineCreateInfo,this->m_depthStencilAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  attachment_00.samples = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  attachment_00.flags = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  attachment_00.format = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  attachment_00.loadOp =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext >> 0x20);
  attachment_00.storeOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  attachment_00.stencilLoadOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  attachment_00.stencilStoreOp = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  attachment_00.initialLayout =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages >> 0x20);
  attachment_00.finalLayout =
       (VkImageLayout)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState;
  Draw::RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment_00);
  _colorAttachments = &colorAttachmentReference;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  uVar47 = 0;
  uVar48 = 0;
  uVar45 = 0;
  uVar46 = 0;
  uVar43 = 1;
  uVar44 = 3;
  uVar41 = 0;
  uVar42 = 0;
  uVar39 = 0x688e7e;
  uVar40 = 0;
  Draw::SubpassDescription::SubpassDescription
            ((SubpassDescription *)&pipelineCreateInfo,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)0x300000001,0,(deUint32 *)0x0);
  lVar28 = 9;
  pPVar30 = &pipelineCreateInfo;
  puVar31 = (undefined8 *)&stack0xfffffffffffff7f8;
  while( true ) {
    if (lVar28 == 0) break;
    lVar28 = lVar28 + -1;
    *puVar31 = *(undefined8 *)&pPVar30->super_VkGraphicsPipelineCreateInfo;
    pPVar30 = (PipelineCreateInfo *)((long)pPVar30 + (ulong)bVar32 * -0x10 + 8);
    puVar31 = puVar31 + (ulong)bVar32 * -2 + 1;
  }
  subpass.pipelineBindPoint = uVar34;
  subpass.flags = uVar33;
  subpass.inputAttachmentCount = uVar35;
  subpass._12_4_ = uVar36;
  subpass.pInputAttachments._0_4_ = uVar37;
  subpass.pInputAttachments._4_4_ = uVar38;
  subpass.colorAttachmentCount = uVar39;
  subpass._28_4_ = uVar40;
  subpass.pColorAttachments._0_4_ = (int)_colorAttachments;
  subpass.pColorAttachments._4_4_ = (int)((ulong)_colorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = uVar41;
  subpass.pResolveAttachments._4_4_ = uVar42;
  subpass.pDepthStencilAttachment._0_4_ = uVar43;
  subpass.pDepthStencilAttachment._4_4_ = uVar44;
  subpass.preserveAttachmentCount = uVar45;
  subpass._60_4_ = uVar46;
  subpass.pPreserveAttachments._0_4_ = uVar47;
  subpass.pPreserveAttachments._4_4_ = uVar48;
  Draw::RenderPassCreateInfo::addSubpass(&renderPassCreateInfo,subpass);
  if (pipelineCreateInfo.m_shaders.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_shaders.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._120_8_ != 0) {
    operator_delete((void *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._120_8_,
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._136_8_ -
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._120_8_);
  }
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pDynamicState !=
      (VkPipelineDynamicStateCreateInfo *)0x0) {
    operator_delete(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pDynamicState,
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.renderPass.m_internal -
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pDynamicState);
  }
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pMultisampleState !=
      (VkPipelineMultisampleStateCreateInfo *)0x0) {
    operator_delete(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pMultisampleState,
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pColorBlendState -
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pMultisampleState);
  }
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_798,this->m_vk,pVVar23,
             &renderPassCreateInfo.super_VkRenderPassCreateInfo,(VkAllocationCallbacks *)0x0);
  uVar20 = auStack_790._16_8_;
  uVar19 = auStack_790._8_8_;
  uVar18 = auStack_790._0_8_;
  HVar17.m_internal = local_798.m_internal;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = auStack_790._8_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = auStack_790._12_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)auStack_790._16_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_798.m_internal;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)auStack_790._0_8_;
  local_798.m_internal = 0;
  auStack_790._0_8_ = (VkAllocationCallbacks *)0x0;
  auStack_790._8_8_ = (VkDevice)0x0;
  auStack_790._16_8_ = (VkAllocationCallbacks *)0x0;
  pMVar6 = &this->m_renderPass;
  VVar11.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (VVar11.m_internal == 0) {
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)uVar19;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)uVar20;
    (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         HVar17.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)uVar18;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               VVar11);
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (local_798.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)auStack_790,
                 (VkRenderPass)local_798.m_internal);
    }
  }
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)&pipelineCreateInfo,1,&vertexInputBindingDescription,2,
             vertexInputAttributeDescriptions);
  *(ulong *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
             vertexAttributeDescriptionCount =
       CONCAT44(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState._4_4_,
                (VkImageLayout)
                pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState);
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = (VkVertexInputAttributeDescription *)
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pInputAssemblyState;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
  vertexBindingDescriptionCount = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       (VkVertexInputBindingDescription *)
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  *(undefined4 *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4 =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&vkCbAttachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,
             VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf
            );
  Draw::PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,
             (VkRenderPass)
             (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,0,0);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_798,local_678,"main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_798);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_798,local_698,"main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_798);
  local_798.m_internal =
       *(deUint64 *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo;
  auStack_790._0_8_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  auStack_790._8_8_ =
       *(undefined8 *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  auStack_790._16_8_ =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_778 = *(VkPipelineColorBlendAttachmentState **)
               &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
                vertexAttributeDescriptionCount;
  pVStack_770 = (VkSpecializationInfo *)
                (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
                pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineVertexInputStateCreateInfo *)&local_798);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_798,this->m_topology,0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)&local_798);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)&local_798,1,
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)&local_798);
  if (local_760 != (pointer)0x0) {
    operator_delete(local_760,(long)local_750 - (long)local_760);
  }
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)&local_798,1,&local_6b8,&local_6d8);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)&local_798);
  if (local_750 != (pointer)0x0) {
    operator_delete(local_750,(long)local_740 - (long)local_750);
  }
  if (local_768 != (pointer)0x0) {
    operator_delete(local_768,(long)local_758 - (long)local_768);
  }
  if (local_6d8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_6b8.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b8.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,
             &(this->m_depthStencilState).super_VkPipelineDepthStencilStateCreateInfo);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_798,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)&local_798);
  framebufferCreateInfo.super_VkFramebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext = (void *)0x0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.flags = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._20_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_ = operator_new(4);
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext =
       (void *)(framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_ + 4);
  *(undefined4 *)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_ = 0xffffffff;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_ =
       framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext;
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)&local_798,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&framebufferCreateInfo,false,
             false);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)&local_798);
  if (local_768 != (pointer)0x0) {
    operator_delete(local_768,(long)local_758 - (long)local_768);
  }
  if (framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_,
                    framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_ -
                    framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_);
  }
  framebufferCreateInfo.super_VkFramebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext = (void *)0x0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.flags = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._20_4_ = 0;
  Draw::PipelineCreateInfo::DynamicState::DynamicState
            ((DynamicState *)&local_798,
             (vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)
             &framebufferCreateInfo);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDynamicStateCreateInfo *)&local_798);
  if (local_778 != (VkPipelineColorBlendAttachmentState *)0x0) {
    operator_delete(local_778,(long)local_768 - (long)local_778);
  }
  if (framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_,
                    framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_ -
                    framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_);
  }
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&framebufferCreateInfo,this->m_vk,pVVar23,
             (VkPipelineCache)0x0,&pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,
             (VkAllocationCallbacks *)0x0);
  VVar11 = framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass;
  uVar19 = framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_;
  pvVar21 = framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext;
  uVar18 = framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_;
  auStack_790._8_8_ = framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_;
  auStack_790._16_8_ = framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal;
  local_798.m_internal = framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_;
  auStack_790._0_8_ = framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext = (void *)0x0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.flags = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._20_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal = 0;
  obj_00.m_internal =
       (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)uVar19;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VVar11.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         uVar18;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)pvVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_00);
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)auStack_790._8_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)auStack_790._16_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         local_798.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)auStack_790._0_8_;
    if (framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)18>_> *)
                 &framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext,
                 (VkPipeline)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_);
    }
  }
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  (attachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].m_internal =
       (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            (&framebufferCreateInfo,
             (VkRenderPass)
             (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &attachments,0x80,0x80,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)local_7b8,this->m_vk,pVVar23,
             &framebufferCreateInfo.super_VkFramebufferCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar13 = DStack_7b0.m_allocator;
  pVVar16 = DStack_7b0.m_device;
  pDVar7 = DStack_7b0.m_deviceIface;
  auVar15 = local_7b8;
  auStack_790._8_8_ = DStack_7b0.m_device;
  auStack_790._16_8_ = DStack_7b0.m_allocator;
  local_798.m_internal = (deUint64)local_7b8;
  auStack_790._0_8_ = DStack_7b0.m_deviceIface;
  local_7b8 = (undefined1  [8])0x0;
  DStack_7b0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_7b0.m_device = (VkDevice)0x0;
  DStack_7b0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_01.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_01.m_internal == 0) {
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         pVVar16;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = pVVar13;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         (deUint64)auVar15;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = pDVar7;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_01);
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)auStack_790._8_8_;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)auStack_790._16_8_;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         local_798.m_internal;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)auStack_790._0_8_;
    if (local_7b8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                (&DStack_7b0,(VkFramebuffer)local_7b8);
    }
  }
  _size = (long)(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pDVar7 = this->m_vk;
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&local_798,_size,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0
            );
  pAVar27 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_7b8,pDVar7,pVVar23,(VkBufferCreateInfo *)&local_798,pAVar27,
             (MemoryRequirement)0x1);
  pSVar8 = (this->m_vertexBuffer).m_state;
  if (pSVar8 != (SharedPtrStateBase *)DStack_7b0.m_deviceIface) {
    if (pSVar8 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar4 = &pSVar8->strongRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        (this->m_vertexBuffer).m_ptr = (Buffer *)0x0;
        (*((this->m_vertexBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar4 = &((this->m_vertexBuffer).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        pSVar8 = (this->m_vertexBuffer).m_state;
        if (pSVar8 != (SharedPtrStateBase *)0x0) {
          (*pSVar8->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_vertexBuffer).m_ptr = (Buffer *)local_7b8;
    (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)DStack_7b0.m_deviceIface;
    if ((SharedPtrStateBase *)DStack_7b0.m_deviceIface == (SharedPtrStateBase *)0x0)
    goto LAB_00689669;
    LOCK();
    *(deInt32 *)((long)DStack_7b0.m_deviceIface + 8U) =
         *(deInt32 *)((long)DStack_7b0.m_deviceIface + 8U) + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((this->m_vertexBuffer).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  if ((SharedPtrStateBase *)DStack_7b0.m_deviceIface != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar4 = (deInt32 *)((long)DStack_7b0.m_deviceIface + 8);
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if (*pdVar4 == 0) {
      local_7b8 = (undefined1  [8])0x0;
      (**(code **)(*(long *)DStack_7b0.m_deviceIface + 0x10))();
    }
    LOCK();
    pdVar4 = (deInt32 *)((long)DStack_7b0.m_deviceIface + 0xc);
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if (*pdVar4 == 0) {
      if ((SharedPtrStateBase *)DStack_7b0.m_deviceIface != (SharedPtrStateBase *)0x0) {
        (**(code **)(*(long *)DStack_7b0.m_deviceIface + 8))();
      }
      DStack_7b0.m_deviceIface = (DeviceInterface *)0x0;
    }
  }
LAB_00689669:
  if (local_760 != (pointer)0x0) {
    operator_delete(local_760,(long)local_750 - (long)local_760);
  }
  pAVar12 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_798.m_internal = (deUint64)&PTR__Allocation_00d1abf8;
  auStack_790._0_8_ = (pAVar12->m_memory).m_internal;
  auStack_790._8_8_ = pAVar12->m_offset;
  pVVar13 = (VkAllocationCallbacks *)pAVar12->m_hostPtr;
  auStack_790._16_8_ = pVVar13;
  ::vk::Allocation::~Allocation((Allocation *)&local_798);
  memcpy(pVVar13,(this->m_data).
                 super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                 ._M_impl.super__Vector_impl_data._M_start,_size);
  pBVar14 = (this->m_vertexBuffer).m_ptr;
  pAVar12 = (pBVar14->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_798.m_internal = (deUint64)&PTR__Allocation_00d1abf8;
  auStack_790._0_8_ = (pAVar12->m_memory).m_internal;
  auStack_790._8_8_ = pAVar12->m_offset;
  auStack_790._16_8_ = pAVar12->m_hostPtr;
  pAVar12 = (pBVar14->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_7b8 = (undefined1  [8])&PTR__Allocation_00d1abf8;
  DStack_7b0.m_deviceIface = (DeviceInterface *)(pAVar12->m_memory).m_internal;
  DStack_7b0.m_device = (VkDevice)pAVar12->m_offset;
  DStack_7b0.m_allocator = (VkAllocationCallbacks *)pAVar12->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (this->m_vk,pVVar23,(VkDeviceMemory)auStack_790._0_8_,(VkDeviceSize)DStack_7b0.m_device,
             _size);
  ::vk::Allocation::~Allocation((Allocation *)local_7b8);
  ::vk::Allocation::~Allocation((Allocation *)&local_798);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo(&cmdPoolCreateInfo,_queueFamilyIndex,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_7b8,this->m_vk,pVVar23,
             &cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar13 = DStack_7b0.m_allocator;
  pVVar16 = DStack_7b0.m_device;
  pDVar7 = DStack_7b0.m_deviceIface;
  auVar15 = local_7b8;
  auStack_790._8_8_ = DStack_7b0.m_device;
  auStack_790._16_8_ = DStack_7b0.m_allocator;
  local_798.m_internal = (deUint64)local_7b8;
  auStack_790._0_8_ = DStack_7b0.m_deviceIface;
  local_7b8 = (undefined1  [8])0x0;
  DStack_7b0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_7b0.m_device = (VkDevice)0x0;
  DStack_7b0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_02.m_internal =
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  if (obj_02.m_internal == 0) {
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         pVVar16;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         pVVar13;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         (deUint64)auVar15;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         pDVar7;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj_02);
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)auStack_790._8_8_;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)auStack_790._16_8_;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         local_798.m_internal;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)auStack_790._0_8_;
    if (local_7b8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&DStack_7b0,(VkCommandPool)local_7b8);
    }
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_7b8,this->m_vk,pVVar23,
             (VkCommandPool)
             (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pVVar13 = DStack_7b0.m_allocator;
  pVVar23 = DStack_7b0.m_device;
  pDVar7 = DStack_7b0.m_deviceIface;
  auVar15 = local_7b8;
  auStack_790._8_8_ = DStack_7b0.m_device;
  auStack_790._16_8_ = DStack_7b0.m_allocator;
  local_798.m_internal = (deUint64)local_7b8;
  auStack_790._0_8_ = DStack_7b0.m_deviceIface;
  local_7b8 = (undefined1  [8])0x0;
  DStack_7b0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_7b0.m_device = (VkDevice)0x0;
  DStack_7b0.m_allocator = (VkAllocationCallbacks *)0x0;
  if ((this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object ==
      (VkCommandBuffer_s *)0x0) {
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = pVVar23;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         (deUint64)pVVar13;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)auVar15;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface = pDVar7
    ;
  }
  else {
    pDVar7 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    (*pDVar7->_vptr_DeviceInterface[0x48])
              (pDVar7,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         auStack_790._8_4_;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + 4)
         = auStack_790._12_4_;
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         auStack_790._16_4_;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
             m_internal + 4) = auStack_790._20_4_;
    *(VkStructureType *)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkStructureType)local_798.m_internal;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 4) =
         local_798.m_internal._4_4_;
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         auStack_790._0_4_;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
     + 4) = auStack_790._4_4_;
    if (local_7b8 != (undefined1  [8])0x0) {
      local_798.m_internal = (deUint64)local_7b8;
      (*(DStack_7b0.m_deviceIface)->_vptr_DeviceInterface[0x48])
                (DStack_7b0.m_deviceIface,DStack_7b0.m_device,DStack_7b0.m_allocator,1);
    }
  }
  if (attachments.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_multisampleStateSampleMask.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_multisampleStateSampleMask.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_scissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_scissors.
                    super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_viewports.
      super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_viewports.
                    super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_dynamicStates.
      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_dynamicStates.
                    super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_colorBlendStateAttachments.
      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_colorBlendStateAttachments.
                    super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_shaders.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_shaders.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo(&renderPassCreateInfo);
  if (depthStencilImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depthStencilImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)depthStencilImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)depthStencilImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (targetImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(targetImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)targetImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)targetImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_698.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_690,local_698);
  }
  if (local_678.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_670,local_678);
  }
  if (pipelineLayoutCreateInfo.m_pushConstantRanges.
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_pushConstantRanges.
                    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineLayoutCreateInfo.m_setLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_setLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void initialize (void)
	{
		const vk::VkDevice device	= m_context.getDevice();

		vk::VkFormatProperties formatProperties;
		// check for VK_FORMAT_D24_UNORM_S8_UINT support
		m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), vk::VK_FORMAT_D24_UNORM_S8_UINT, &formatProperties);
		if (formatProperties.optimalTilingFeatures & vk::VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
		{
			m_depthStencilAttachmentFormat = vk::VK_FORMAT_D24_UNORM_S8_UINT;
		}
		else
		{
			// check for VK_FORMAT_D32_SFLOAT_S8_UINT support
			m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), vk::VK_FORMAT_D32_SFLOAT_S8_UINT, &formatProperties);
			if (formatProperties.optimalTilingFeatures & vk::VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
			{
				m_depthStencilAttachmentFormat = vk::VK_FORMAT_D32_SFLOAT_S8_UINT;
			}
			else
				throw tcu::NotSupportedError("No valid depth stencil attachment available");
		}

		const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
		m_pipelineLayout			= vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

		const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
		const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

		const vk::VkExtent3D imageExtent = { WIDTH, HEIGHT, 1 };
		ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
											  vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		m_colorTargetImage = Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

		const ImageCreateInfo depthStencilImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_depthStencilAttachmentFormat, imageExtent,
														  1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
														  vk::VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		m_depthStencilImage = Image::createAndAlloc(m_vk, device, depthStencilImageCreateInfo, m_context.getDefaultAllocator());

		const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
		m_colorTargetView = vk::createImageView(m_vk, device, &colorTargetViewInfo);

		const ImageViewCreateInfo attachmentViewInfo(m_depthStencilImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_depthStencilAttachmentFormat);
		m_attachmentView = vk::createImageView(m_vk, device, &attachmentViewInfo);

		RenderPassCreateInfo renderPassCreateInfo;
		renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
																 vk::VK_SAMPLE_COUNT_1_BIT,
																 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_IMAGE_LAYOUT_GENERAL,
																 vk::VK_IMAGE_LAYOUT_GENERAL));

		renderPassCreateInfo.addAttachment(AttachmentDescription(m_depthStencilAttachmentFormat,
																 vk::VK_SAMPLE_COUNT_1_BIT,
																 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL));

		const vk::VkAttachmentReference colorAttachmentReference =
		{
			0,
			vk::VK_IMAGE_LAYOUT_GENERAL
		};

		const vk::VkAttachmentReference depthAttachmentReference =
		{
			1,
			vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL
		};

		renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
														   0,
														   0,
														   DE_NULL,
														   1,
														   &colorAttachmentReference,
														   DE_NULL,
														   depthAttachmentReference,
														   0,
														   DE_NULL));

		m_renderPass = vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

		const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
		{
			0,
			(deUint32)sizeof(tcu::Vec4) * 2,
			vk::VK_VERTEX_INPUT_RATE_VERTEX,
		};

		const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
		{
			{
				0u,
				0u,
				vk::VK_FORMAT_R32G32B32A32_SFLOAT,
				0u
			},
			{
				1u,
				0u,
				vk::VK_FORMAT_R32G32B32A32_SFLOAT,
				(deUint32)(sizeof(float)* 4),
			}
		};

		m_vertexInputState = PipelineCreateInfo::VertexInputState(1,
																  &vertexInputBindingDescription,
																  2,
																  vertexInputAttributeDescriptions);

		const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1));
		pipelineCreateInfo.addState(m_depthStencilState);
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

		m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);

		std::vector<vk::VkImageView> attachments(2);
		attachments[0] = *m_colorTargetView;
		attachments[1] = *m_attachmentView;

		const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, attachments, WIDTH, HEIGHT, 1);

		m_framebuffer = vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

		const vk::VkDeviceSize dataSize = m_data.size() * sizeof(PositionColorVertex);
		m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize,
			vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT),
			m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

		deUint8* ptr = reinterpret_cast<unsigned char *>(m_vertexBuffer->getBoundMemory().getHostPtr());
		deMemcpy(ptr, &m_data[0], static_cast<size_t>(dataSize));

		vk::flushMappedMemoryRange(m_vk, device,
								   m_vertexBuffer->getBoundMemory().getMemory(),
								   m_vertexBuffer->getBoundMemory().getOffset(),
								   dataSize);

		const CmdPoolCreateInfo cmdPoolCreateInfo(m_context.getUniversalQueueFamilyIndex());
		m_cmdPool = vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);
		m_cmdBuffer = vk::allocateCommandBuffer(m_vk, device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY);
	}